

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall
Memory::Recycler::VerifyMarkArenaMemoryBlockList(Recycler *this,ArenaMemoryBlock *memoryBlocks)

{
  ulong uVar1;
  size_t i;
  ulong uVar2;
  
  for (; memoryBlocks != (ArenaMemoryBlock *)0x0; memoryBlocks = (memoryBlocks->field_0).next) {
    uVar1 = memoryBlocks->nbytes;
    for (uVar2 = 0; uVar1 >> 3 != uVar2; uVar2 = uVar2 + 1) {
      VerifyMark(this,(&memoryBlocks[1].field_0)[uVar2].next);
    }
  }
  return;
}

Assistant:

void
Recycler::VerifyMarkArenaMemoryBlockList(ArenaMemoryBlock * memoryBlocks)
{
    size_t scanRootBytes = 0;
    ArenaMemoryBlock *blockp = memoryBlocks;
    while (blockp != NULL)
    {
        void** base=(void**)blockp->GetBytes();
        size_t slotCount = blockp->nbytes / sizeof(void*);
        scanRootBytes += blockp->nbytes;
        for (size_t i=0; i< slotCount; i++)
        {
            VerifyMark(base[i]);
        }
        blockp = blockp->next;
    }
}